

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O1

float GEN_CS::safe_probability(float prob)

{
  ostream *poVar1;
  
  if (prob <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Probability ",0xc);
    poVar1 = std::ostream::_M_insert<double>((double)prob);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," is not possible, replacing with 1e-3.  Fix your dataset. ",0x3a);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    prob = 0.001;
  }
  return prob;
}

Assistant:

float safe_probability(float prob)
{
  if (prob <= 0.)
  {
    std::cout << "Probability " << prob << " is not possible, replacing with 1e-3.  Fix your dataset. " << std::endl;
    return 1e-3f;
  }
  else
    return prob;
}